

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyDecompressor::ReadUncompressedLength(SnappyDecompressor *this,uint32_t *result)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long in_RAX;
  undefined4 extraout_var;
  char cVar5;
  uint uVar6;
  size_t n;
  long local_38;
  
  *result = 0;
  uVar6 = 0;
  local_38 = in_RAX;
  do {
    if (0x1f < uVar6) goto LAB_01113765;
    iVar4 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
    cVar5 = '\x01';
    uVar2 = uVar6;
    if (local_38 != 0) {
      bVar1 = *(byte *)CONCAT44(extraout_var,iVar4);
      (*this->reader_->_vptr_Source[4])(this->reader_,1);
      if (((&LeftShiftOverflows(unsigned_char,unsigned_int)::masks)[uVar6] & (byte)(bVar1 & 0x7f))
          == 0) {
        *result = *result | (bVar1 & 0x7f) << ((byte)uVar6 & 0x1f);
        cVar5 = (-1 < (char)bVar1) * '\x03';
        uVar2 = uVar6 + 7;
        if (-1 < (char)bVar1) {
          uVar2 = uVar6;
        }
      }
    }
    uVar6 = uVar2;
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
    bVar3 = true;
  }
  else {
LAB_01113765:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ReadUncompressedLength(uint32_t* result) {
    assert(ip_ == NULL);  // Must not have read anything yet
    // Length is encoded in 1..5 bytes
    *result = 0;
    uint32_t shift = 0;
    while (true) {
      if (shift >= 32) return false;
      size_t n;
      const char* ip = reader_->Peek(&n);
      if (n == 0) return false;
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
      reader_->Skip(1);
      uint32_t val = c & 0x7f;
      if (LeftShiftOverflows(static_cast<uint8_t>(val), shift)) return false;
      *result |= val << shift;
      if (c < 128) {
        break;
      }
      shift += 7;
    }
    return true;
  }